

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  float _y;
  ImGuiID IVar1;
  ImGuiColumnsSet *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_rect;
  float column_hw;
  ImGuiID column_id;
  float x;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiColumnsSet *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined1 in_stack_ffffffffffffff63;
  ImGuiID in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  ImDrawList *in_stack_ffffffffffffff70;
  ImGuiButtonFlags in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 in_stack_ffffffffffffffb8;
  ImVec2 in_stack_ffffffffffffffc0;
  int local_2c;
  
  pIVar4 = GetCurrentWindow();
  pIVar2 = (pIVar4->DC).ColumnsSet;
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  fVar5 = ImMax<float>(pIVar2->LineMaxY,(pIVar4->DC).CursorPos.y);
  pIVar2->LineMaxY = fVar5;
  (pIVar4->DC).CursorPos.y = pIVar2->LineMaxY;
  if ((pIVar2->Flags & 0x10U) == 0) {
    (pIVar4->DC).CursorMaxPos.x = pIVar2->StartMaxPosX;
  }
  if (((pIVar2->Flags & 1U) == 0) && ((pIVar4->SkipItems & 1U) == 0)) {
    fVar5 = pIVar2->StartPosY;
    _y = (pIVar4->DC).CursorPos.y;
    for (local_2c = 1; local_2c < pIVar2->Count; local_2c = local_2c + 1) {
      fVar8 = (pIVar4->Pos).x;
      fVar6 = GetColumnOffset((int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      fVar6 = fVar8 + fVar6;
      IVar1 = pIVar2->ID;
      fVar7 = GetColumnsRectHalfWidth();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,fVar6 - fVar7,fVar5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,fVar6 + fVar7,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffb8,(ImVec2 *)&stack0xffffffffffffffb0,
                     (ImVec2 *)&stack0xffffffffffffffa8);
      KeepAliveID(IVar1 + local_2c);
      bVar3 = IsClippedEx((ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff64,(bool)in_stack_ffffffffffffff63);
      if (!bVar3) {
        if ((pIVar2->Flags & 2U) == 0) {
          ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (ImGuiID)in_stack_ffffffffffffff94,
                         (bool *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (bool *)CONCAT44(in_stack_ffffffffffffff84,fVar8),in_stack_ffffffffffffff7c
                        );
        }
        in_stack_ffffffffffffff7c = 0x1b;
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    SUB84(in_stack_ffffffffffffff70,0));
        in_stack_ffffffffffffff68 = (float)(int)fVar6;
        in_stack_ffffffffffffff70 = pIVar4->DrawList;
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68;
        fVar8 = ImMax<float>(fVar5 + 1.0,(pIVar4->ClipRect).Min.y);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,in_stack_ffffffffffffff68,fVar8);
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff6c;
        fVar8 = ImMin<float>(_y,(pIVar4->ClipRect).Max.y);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,in_stack_ffffffffffffff6c,fVar8);
        ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffffc0,
                            (ImVec2 *)in_stack_ffffffffffffffb8,(ImVec2 *)in_stack_ffffffffffffffb0,
                            (ImU32)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
    }
  }
  pIVar2->IsBeingResized = false;
  (pIVar4->DC).ColumnsSet = (ImGuiColumnsSet *)0x0;
  (pIVar4->DC).ColumnsOffset.x = 0.0;
  (pIVar4->DC).CursorPos.x =
       (float)(int)((pIVar4->Pos).x + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->StartMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = columns->StartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hw = GetColumnsRectHalfWidth(); // Half-width for interaction
            const ImRect column_rect(ImVec2(x - column_hw, y1), ImVec2(x + column_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(columns->Columns[n].Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column (we clip the Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.)
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, ImMax(y1 + 1.0f, window->ClipRect.Min.y)), ImVec2(xi, ImMin(y2, window->ClipRect.Max.y)), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.ColumnsSet = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}